

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmJoin<std::vector<int,std::allocator<int>>>
                   (string *__return_storage_ptr__,vector<int,_std::allocator<int>_> *rng,
                   string_view separator)

{
  bool bVar1;
  reference piVar2;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *__lhs;
  basic_ostream<char,_std::char_traits<char>_> *this;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1b0;
  const_iterator end;
  const_iterator it;
  ostringstream os;
  vector<int,_std::allocator<int>_> *rng_local;
  string_view separator_local;
  
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(rng);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&it);
    end = std::vector<int,_std::allocator<int>_>::begin(rng);
    local_1b0._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(rng);
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&end);
    std::ostream::operator<<((ostringstream *)&it,*piVar2);
    while( true ) {
      __lhs = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&end);
      bVar1 = __gnu_cxx::operator!=(__lhs,&local_1b0);
      if (!bVar1) break;
      this = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&it,separator);
      piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&end);
      std::ostream::operator<<(this,*piVar2);
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&it);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmJoin(Range const& rng, cm::string_view separator)
{
  if (rng.empty()) {
    return std::string();
  }

  std::ostringstream os;
  auto it = rng.begin();
  auto const end = rng.end();
  os << *it;
  while (++it != end) {
    os << separator << *it;
  }
  return os.str();
}